

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# order_book.cc
# Opt level: O1

void __thiscall helix::order_book::cancel(order_book *this,uint64_t order_id,uint64_t quantity)

{
  type *this_00;
  long *plVar1;
  size_type *psVar2;
  bool bVar3;
  iterator x;
  invalid_argument *this_01;
  iterator it;
  hashed_index_node<boost::multi_index::detail::index_node_base<helix::order,_std::allocator<helix::order>_>_>
  *local_98;
  uint64_t local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  this_00 = &(this->_orders).super_type;
  local_90 = order_id;
  x = boost::multi_index::detail::
      hashed_index<boost::multi_index::member<helix::order,unsigned_long,&helix::order::id>,boost::hash<unsigned_long>,std::equal_to<unsigned_long>,boost::multi_index::detail::nth_layer<1,helix::order,boost::multi_index::indexed_by<boost::multi_index::hashed_unique<boost::multi_index::member<helix::order,unsigned_long,&helix::order::id>,mpl_::na,mpl_::na,mpl_::na>,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,std::allocator<helix::order>>,boost::mpl::vector0<mpl_::na>,boost::multi_index::detail::hashed_unique_tag>
      ::find<unsigned_long,boost::hash<unsigned_long>,std::equal_to<unsigned_long>>
                ((hashed_index<boost::multi_index::member<helix::order,unsigned_long,&helix::order::id>,boost::hash<unsigned_long>,std::equal_to<unsigned_long>,boost::multi_index::detail::nth_layer<1,helix::order,boost::multi_index::indexed_by<boost::multi_index::hashed_unique<boost::multi_index::member<helix::order,unsigned_long,&helix::order::id>,mpl_::na,mpl_::na,mpl_::na>,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,std::allocator<helix::order>>,boost::mpl::vector0<mpl_::na>,boost::multi_index::detail::hashed_unique_tag>
                  *)this_00,&local_90,&(this->_orders).super_type.field_0x1,
                 &(this->_orders).super_type.field_0x2);
  local_98 = x.node;
  if (x.node != (this->_orders).
                super_header_holder<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::index_node_base<helix::order,_std::allocator<helix::order>_>_>_*,_boost::multi_index::multi_index_container<helix::order,_boost::multi_index::indexed_by<boost::multi_index::hashed_unique<boost::multi_index::member<helix::order,_unsigned_long,_&helix::order::id>,_mpl_::na,_mpl_::na,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<helix::order>_>_>
                .member) {
    plVar1 = (long *)((long)&((x.node)->
                             super_index_node_base<helix::order,_std::allocator<helix::order>_>).
                             super_pod_value_holder<helix::order>.space.data_ + 0x18);
    *plVar1 = *plVar1 - quantity;
    plVar1 = (long *)((long)((x.node)->
                            super_index_node_base<helix::order,_std::allocator<helix::order>_>).
                            super_pod_value_holder<helix::order>.space.data_.align_ + 8);
    *plVar1 = *plVar1 - quantity;
    bVar3 = boost::multi_index::detail::
            hashed_index<boost::multi_index::member<helix::order,_unsigned_long,_&helix::order::id>,_boost::hash<unsigned_long>,_std::equal_to<unsigned_long>,_boost::multi_index::detail::nth_layer<1,_helix::order,_boost::multi_index::indexed_by<boost::multi_index::hashed_unique<boost::multi_index::member<helix::order,_unsigned_long,_&helix::order::id>,_mpl_::na,_mpl_::na,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<helix::order>_>,_boost::mpl::vector0<mpl_::na>,_boost::multi_index::detail::hashed_unique_tag>
            ::modify_(this_00,x.node);
    if (!bVar3) {
      operator_delete(x.node,0x40);
      psVar2 = &(this->_orders).node_count;
      *psVar2 = *psVar2 - 1;
    }
    if (*(long *)((long)&((x.node)->
                         super_index_node_base<helix::order,_std::allocator<helix::order>_>).
                         super_pod_value_holder<helix::order>.space.data_ + 0x18) == 0) {
      remove(this,(char *)&local_98);
    }
    return;
  }
  this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"invalid order id: ","");
  std::__cxx11::to_string(&local_68,local_90);
  std::operator+(&local_48,&local_88,&local_68);
  std::invalid_argument::invalid_argument(this_01,(string *)&local_48);
  __cxa_throw(this_01,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void order_book::cancel(uint64_t order_id, uint64_t quantity)
{
    auto it = _orders.find(order_id);
    if (it == _orders.end()) {
        throw std::invalid_argument(std::string("invalid order id: ") + std::to_string(order_id));
    }
    _orders.modify(it, [quantity](order& order) {
        order.quantity -= quantity;
        order.level->size -= quantity;
    });
    if (!it->quantity) {
        remove(it);
    }
}